

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O2

int CreateBotDist(DdNode *node,st__table *pathTable,uint *pathLengthArray,FILE *fp)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  DdHalfWord DVar4;
  uint uVar5;
  uint uVar6;
  int *key;
  uint uVar7;
  ulong uVar8;
  NodeDist_t *pNVar9;
  char *__ptr;
  ulong uVar10;
  size_t sStack_70;
  NodeDist_t *nodeStatChild;
  NodeDist_t *nodeStat;
  ulong local_38;
  
  key = (int *)((ulong)node & 0xfffffffffffffffe);
  iVar2 = 1;
  if (*key != 0x7fffffff) {
    iVar2 = st__lookup(pathTable,(char *)key,(char **)&nodeStat);
    if (iVar2 == 0) {
      __ptr = "Something wrong, the entry doesn\'t exist\n";
      sStack_70 = 0x29;
LAB_0062b14c:
      fwrite(__ptr,sStack_70,1,(FILE *)fp);
LAB_0062b15a:
      iVar2 = 0;
    }
    else {
      uVar7 = 0xffffffff;
      uVar5 = uVar7;
      if ((nodeStat->oddTopDist != 0xffffffff) &&
         (uVar5 = nodeStat->oddTopDist + nodeStat->oddBotDist, nodeStat->oddBotDist == 0xffffffff))
      {
        uVar5 = 0xffffffff;
      }
      uVar6 = uVar7;
      if ((nodeStat->evenTopDist != 0xffffffff) &&
         (uVar6 = nodeStat->evenTopDist + nodeStat->evenBotDist, nodeStat->evenBotDist == 0xffffffff
         )) {
        uVar6 = 0xffffffff;
      }
      if (uVar5 < uVar6) {
        uVar6 = uVar5;
      }
      uVar8 = *(ulong *)(key + 4);
      uVar1 = *(ulong *)(key + 6);
      local_38 = (ulong)((uint)node & 1);
      pNVar9 = nodeStat;
      for (iVar2 = 0; (uVar10 = uVar8, iVar2 == 0 || (uVar10 = uVar1, iVar2 != 2));
          iVar2 = iVar2 + 1) {
        if (*(int *)(uVar10 & 0xfffffffffffffffe) == 0x7fffffff) {
          if ((uVar10 & 1) == 0) {
            pNVar9->evenBotDist = 1;
          }
          else {
            pNVar9->oddBotDist = 1;
          }
        }
        else {
          iVar3 = st__lookup(pathTable,(char *)(uVar10 & 0xfffffffffffffffe),(char **)&nodeStatChild
                            );
          if (iVar3 == 0) {
            __ptr = "Something wrong, node in table should have been created in top dist proc.\n";
            sStack_70 = 0x4a;
            goto LAB_0062b14c;
          }
          if (nodeStatChild->oddBotDist == 0xffffffff) {
            if (nodeStatChild->evenBotDist != 0xffffffff) {
              __ptr = "Something wrong, both bot nodeStats should be there\n";
              sStack_70 = 0x34;
              goto LAB_0062b14c;
            }
            iVar3 = CreateBotDist((DdNode *)(local_38 ^ uVar10),pathTable,pathLengthArray,fp);
            if (iVar3 == 0) goto LAB_0062b15a;
          }
          if ((uVar10 & 1) == 0) {
            uVar5 = nodeStatChild->evenBotDist + 1;
            if (uVar5 == 0) {
              uVar5 = uVar7;
            }
            if (uVar5 < nodeStat->evenBotDist) {
              nodeStat->evenBotDist = uVar5;
            }
            DVar4 = nodeStatChild->oddBotDist;
          }
          else {
            uVar5 = nodeStatChild->oddBotDist + 1;
            if (uVar5 == 0) {
              uVar5 = uVar7;
            }
            if (uVar5 < nodeStat->evenBotDist) {
              nodeStat->evenBotDist = uVar5;
            }
            DVar4 = nodeStatChild->evenBotDist;
          }
          uVar5 = DVar4 + 1;
          if (DVar4 + 1 == 0) {
            uVar5 = uVar7;
          }
          pNVar9 = nodeStat;
          if (uVar5 < nodeStat->oddBotDist) {
            nodeStat->oddBotDist = uVar5;
          }
        }
      }
      uVar5 = 0xffffffff;
      uVar8 = 0xffffffff;
      if (pNVar9->oddTopDist != 0xffffffff) {
        uVar7 = pNVar9->oddTopDist + pNVar9->oddBotDist;
        if (pNVar9->oddBotDist == 0xffffffff) {
          uVar7 = 0xffffffff;
        }
        uVar8 = (ulong)uVar7;
      }
      iVar2 = 1;
      if ((pNVar9->evenTopDist != 0xffffffff) &&
         (uVar5 = pNVar9->evenTopDist + pNVar9->evenBotDist, pNVar9->evenBotDist == 0xffffffff)) {
        uVar5 = 0xffffffff;
      }
      if ((uint)uVar8 < uVar6) {
        if (uVar6 != 0xffffffff) {
          pathLengthArray[uVar6] = pathLengthArray[uVar6] - 1;
        }
        pathLengthArray[uVar8] = pathLengthArray[uVar8] + 1;
        uVar6 = (uint)uVar8;
      }
      if (uVar5 < uVar6) {
        if (uVar6 != 0xffffffff) {
          pathLengthArray[uVar6] = pathLengthArray[uVar6] - 1;
        }
        pathLengthArray[uVar5] = pathLengthArray[uVar5] + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static NodeStat *
CreateBotDist(
  DdNode * node,
  st__table * distanceTable)
{
    DdNode *N, *Nv, *Nnv;
    int distance, distanceNv, distanceNnv;
    NodeStat *nodeStat, *nodeStatNv, *nodeStatNnv;

#if 0
    if (Cudd_IsConstant(node)) {
        return(0);
    }
#endif
    
    /* Return the entry in the table if found. */
    N = Cudd_Regular(node);
    if ( st__lookup(distanceTable, (const char *)N, (char **)&nodeStat)) {
        nodeStat->localRef++;
        return(nodeStat);
    }

    Nv = cuddT(N);
    Nnv = cuddE(N);
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* Recur on the children. */
    nodeStatNv = CreateBotDist(Nv, distanceTable);
    if (nodeStatNv == NULL) return(NULL);
    distanceNv = nodeStatNv->distance;

    nodeStatNnv = CreateBotDist(Nnv, distanceTable);
    if (nodeStatNnv == NULL) return(NULL);
    distanceNnv = nodeStatNnv->distance;
    /* Store max distance from constant; note sometimes this distance
    ** may be to 0.
    */
    distance = (distanceNv > distanceNnv) ? (distanceNv+1) : (distanceNnv + 1);

    nodeStat = ABC_ALLOC(NodeStat, 1);
    if (nodeStat == NULL) {
        return(0);
    }
    nodeStat->distance = distance;
    nodeStat->localRef = 1;
    
    if ( st__insert(distanceTable, (char *)N, (char *)nodeStat) ==
        st__OUT_OF_MEM) {
        return(0);

    }
    return(nodeStat);

}